

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7284ee::HighbdDrPredTest_OperationCheck_Test::TestBody
          (HighbdDrPredTest_OperationCheck_Test *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint p_angle;
  
  if ((this->super_HighbdDrPredTest).
      super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
      .params_.tst_fn !=
      (_func_void_unsigned_short_ptr_long_int_int_unsigned_short_ptr_unsigned_short_ptr_int_int_int_int_int
       *)0x0) {
    (this->super_HighbdDrPredTest).
    super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
    .enable_upsample_ = 0;
    do {
      p_angle = (this->super_HighbdDrPredTest).
                super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                .start_angle_;
      if ((int)p_angle <
          (this->super_HighbdDrPredTest).
          super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          .stop_angle_) {
        uVar4 = 0x10e - p_angle;
        do {
          uVar1 = p_angle;
          if (p_angle - 1 < 0x59) {
LAB_004d1dbf:
            iVar2 = (int)dr_intra_derivative[uVar1];
          }
          else {
            iVar2 = 1;
            if (p_angle - 0x5b < 0x59) {
              uVar1 = 0xb4 - p_angle;
              goto LAB_004d1dbf;
            }
          }
          (this->super_HighbdDrPredTest).
          super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          .dx_ = iVar2;
          if (p_angle - 0x5b < 0x59) {
            uVar1 = p_angle - 0x5a;
LAB_004d1deb:
            iVar3 = (int)dr_intra_derivative[uVar1];
          }
          else {
            iVar3 = 1;
            uVar1 = uVar4;
            if (p_angle - 0xb5 < 0x59) goto LAB_004d1deb;
          }
          (this->super_HighbdDrPredTest).
          super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
          .dy_ = iVar3;
          if ((iVar2 != 0) && (iVar3 != 0)) {
            DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
            ::RunTest((DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                       *)this,false,false,p_angle);
          }
          p_angle = p_angle + 1;
          uVar4 = uVar4 - 1;
        } while ((int)p_angle <
                 (this->super_HighbdDrPredTest).
                 super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
                 .stop_angle_);
      }
      iVar2 = (this->super_HighbdDrPredTest).
              super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
              .enable_upsample_;
      (this->super_HighbdDrPredTest).
      super_DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
      .enable_upsample_ = iVar2 + 1;
    } while (iVar2 < 1);
  }
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, OperationCheck) {
  if (params_.tst_fn == nullptr) return;
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; angle++) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, false, angle);
    }
  }
}